

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O2

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
bf_crc::convert_uint8_to_bitset
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          uint8_t *array,size_t size)

{
  byte bVar1;
  ulong *puVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  size_type pos;
  long lVar6;
  reference rVar7;
  allocator<unsigned_long> local_41;
  size_t local_40;
  ulong local_38;
  
  uVar5 = 0;
  local_40 = size;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,size * 8,0,&local_41);
  for (uVar4 = 0; uVar4 < local_40; uVar4 = uVar4 + 1) {
    pos = (size_type)uVar5;
    local_38 = pos;
    for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
      bVar1 = array[uVar4];
      rVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (__return_storage_ptr__,pos);
      puVar2 = rVar7.m_block;
      if ((bVar1 >> ((int)lVar6 - 1U & 0x1f) & 1) == 0) {
        uVar3 = ~rVar7.m_mask & *puVar2;
      }
      else {
        uVar3 = rVar7.m_mask | *puVar2;
      }
      *puVar2 = uVar3;
      pos = pos + 1;
    }
    uVar5 = (int)local_38 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> bf_crc::convert_uint8_to_bitset(const uint8_t array[], size_t size) {

	boost::dynamic_bitset<> retVal(size*8);

	for (unsigned int i = 0; i < size; i++)
		for (int j = 0; j < 8; j++)
			retVal[i*8+j] = (array[i] >> (7-j)) & 0x1 ? true : false;

	return retVal;
}